

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn_codecs_prim.c
# Opt level: O0

asn_dec_rval_t
xer_decode_primitive
          (asn_codec_ctx_t *opt_codec_ctx,asn_TYPE_descriptor_t *td,void **sptr,size_t struct_size,
          char *opt_mname,void *buf_ptr,size_t size,xer_primitive_body_decoder_f *prim_body_decoder)

{
  void *pvVar1;
  size_t in_RCX;
  long *in_RDX;
  undefined8 *in_RSI;
  _func_ssize_t_void_ptr_void_ptr_size_t_int *in_R8;
  _func_int_void_ptr_void_ptr_size_t *in_R9;
  asn_dec_rval_t aVar2;
  code *in_stack_00000010;
  char ch;
  asn_dec_rval_t rc;
  xdp_arg_s s_arg;
  asn_struct_ctx_t s_ctx;
  char *xml_tag;
  asn_dec_rval_t tmp_error;
  char *local_d8;
  char *local_d0;
  char *local_c0;
  undefined1 local_a9;
  asn_dec_rval_code_e local_a8;
  undefined4 uStackY_a4;
  size_t sStackY_a0;
  asn_dec_rval_code_e local_98;
  undefined4 uStackY_94;
  size_t sStackY_90;
  undefined8 *puVar3;
  int iVar4;
  int iVar5;
  ulong local_10;
  size_t local_8;
  
  if (*in_RDX == 0) {
    pvVar1 = calloc(1,in_RCX);
    *in_RDX = (long)pvVar1;
    if (*in_RDX == 0) {
      local_10 = 2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        local_c0 = "";
      }
      else {
        local_c0 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",local_c0);
      goto LAB_00169150;
    }
  }
  pvVar1 = (void *)*in_RDX;
  iVar4 = 0;
  iVar5 = 0;
  puVar3 = in_RSI;
  aVar2 = xer_decode_general((asn_codec_ctx_t *)0x0,(asn_struct_ctx_t *)0x0,(void *)0x0,
                             (char *)in_stack_00000010,pvVar1,(size_t)in_RSI,in_R9,in_R8);
  sStackY_a0 = aVar2.consumed;
  local_a8 = aVar2.code;
  uStackY_94 = uStackY_a4;
  local_98 = local_a8;
  sStackY_90 = sStackY_a0;
  if (local_a8 == RC_OK) {
    if (iVar4 == 0) {
      ASN_DEBUG("Primitive body is not recognized, supplying empty one");
      iVar4 = (*in_stack_00000010)(puVar3,pvVar1,&local_a9,0);
      if (iVar4 != 4) {
        local_10 = 2;
        local_8 = 0;
        if (in_RSI == (undefined8 *)0x0) {
          local_d0 = "";
        }
        else {
          local_d0 = (char *)*in_RSI;
        }
        ASN_DEBUG("Failed to decode element %s",local_d0);
        goto LAB_00169150;
      }
    }
  }
  else if (local_a8 == RC_WMORE) {
    sStackY_90 = 0;
  }
  else if (local_a8 == RC_FAIL) {
    sStackY_90 = 0;
    if (iVar5 == 0) {
      local_10 = 2;
      local_8 = 0;
      if (in_RSI == (undefined8 *)0x0) {
        local_d8 = "";
      }
      else {
        local_d8 = (char *)*in_RSI;
      }
      ASN_DEBUG("Failed to decode element %s",local_d8);
      goto LAB_00169150;
    }
    local_98 = RC_WMORE;
  }
  local_10 = (ulong)local_98;
  local_8 = sStackY_90;
LAB_00169150:
  aVar2.consumed = local_8;
  aVar2._0_8_ = local_10;
  return aVar2;
}

Assistant:

asn_dec_rval_t
xer_decode_primitive(asn_codec_ctx_t *opt_codec_ctx,
	asn_TYPE_descriptor_t *td,
	void **sptr,
	size_t struct_size,
	const char *opt_mname,
	const void *buf_ptr, size_t size,
	xer_primitive_body_decoder_f *prim_body_decoder
) {
	const char *xml_tag = opt_mname ? opt_mname : td->xml_tag;
	asn_struct_ctx_t s_ctx;
	struct xdp_arg_s s_arg;
	asn_dec_rval_t rc;

	/*
	 * Create the structure if does not exist.
	 */
	if(!*sptr) {
		*sptr = CALLOC(1, struct_size);
		if(!*sptr) ASN__DECODE_FAILED;
	}

	memset(&s_ctx, 0, sizeof(s_ctx));
	s_arg.type_descriptor = td;
	s_arg.struct_key = *sptr;
	s_arg.prim_body_decoder = prim_body_decoder;
	s_arg.decoded_something = 0;
	s_arg.want_more = 0;

	rc = xer_decode_general(opt_codec_ctx, &s_ctx, &s_arg,
		xml_tag, buf_ptr, size,
		xer_decode__unexpected_tag, xer_decode__primitive_body);
	switch(rc.code) {
	case RC_OK:
		if(!s_arg.decoded_something) {
			char ch;
			ASN_DEBUG("Primitive body is not recognized, "
				"supplying empty one");
			/*
			 * Decoding opportunity has come and gone.
			 * Where's the result?
			 * Try to feed with empty body, see if it eats it.
			 */
			if(prim_body_decoder(s_arg.type_descriptor,
				s_arg.struct_key, &ch, 0)
					!= XPBD_BODY_CONSUMED) {
				/*
				 * This decoder does not like empty stuff.
				 */
				ASN__DECODE_FAILED;
			}
		}
		break;
	case RC_WMORE:
		/*
		 * Redo the whole thing later.
		 * We don't have a context to save intermediate parsing state.
		 */
		rc.consumed = 0;
		break;
	case RC_FAIL:
		rc.consumed = 0;
		if(s_arg.want_more)
			rc.code = RC_WMORE;
		else
			ASN__DECODE_FAILED;
		break;
	}
	return rc;
}